

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
* __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
::operator=(btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
            *this,btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                  *x)

{
  btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *x_local;
  btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *this_local;
  
  if (this != x) {
    clear(this);
    std::
    swap<std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,256,false>>*>
              (&this->root_,&x->root_);
    std::
    swap<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,256,false>>*>
              (&this->rightmost_,&x->rightmost_);
    std::swap<unsigned_long>(&this->size_,&x->size_);
  }
  return this;
}

Assistant:

auto btree<P>::operator=(btree &&x) noexcept -> btree & {
        if (this != &x) {
            clear();

            using std::swap;
            if (phmap::allocator_traits<
                allocator_type>::propagate_on_container_copy_assignment::value) {
                // Note: `root_` also contains the allocator and the key comparator.
                swap(root_, x.root_);
                swap(rightmost_, x.rightmost_);
                swap(size_, x.size_);
            } else {
                if (allocator() == x.allocator()) {
                    swap(mutable_root(), x.mutable_root());
                    swap(*mutable_key_comp(), *x.mutable_key_comp());
                    swap(rightmost_, x.rightmost_);
                    swap(size_, x.size_);
                } else {
                    // We aren't allowed to propagate the allocator and the allocator is
                    // different so we can't take over its memory. We must move each element
                    // individually. We need both `x` and `this` to have `x`s key comparator
                    // while moving the values so we can't swap the key comparators.
                    *mutable_key_comp() = x.key_comp();
                    copy_or_move_values_in_order(&x);
                }
            }
        }
        return *this;
    }